

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

MAP_RESULT Map_ContainsKey(MAP_HANDLE handle,char *key,_Bool *keyExists)

{
  LOGGER_LOG p_Var1;
  char **ppcVar2;
  MAP_RESULT MVar3;
  
  if ((key == (char *)0x0 || handle == (MAP_HANDLE)0x0) || keyExists == (_Bool *)0x0) {
    p_Var1 = xlogging_get_log_function();
    MVar3 = MAP_INVALIDARG;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_ContainsKey",0x1fb,1,"result = %s%s (%d)","",MAP_RESULTStringStorage[3],3);
    }
  }
  else {
    ppcVar2 = findKey(handle,key);
    *keyExists = ppcVar2 != (char **)0x0;
    MVar3 = MAP_OK;
  }
  return MVar3;
}

Assistant:

MAP_RESULT Map_ContainsKey(MAP_HANDLE handle, const char* key, bool* keyExists)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_024: [If parameter handle, key or keyExists are NULL then Map_ContainsKey shall return MAP_INVALIDARG.]*/
    if (
        (handle ==NULL) ||
        (key == NULL) ||
        (keyExists == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        /*Codes_SRS_MAP_02_025: [Otherwise if a key exists then Map_ContainsKey shall return MAP_OK and shall write in keyExists "true".]*/
        /*Codes_SRS_MAP_02_026: [If a key doesn't exist, then Map_ContainsKey shall return MAP_OK and write in keyExists "false".] */
        *keyExists = (findKey(handleData, key) != NULL) ? true: false;
        result = MAP_OK;
    }
    return result;
}